

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,DescriptorKeyReference *object)

{
  DescriptorKeyReference *object_local;
  DescriptorKeyReference *this_local;
  
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  KeyData::KeyData(&this->key_data_);
  ::std::__cxx11::string::string((string *)&this->argument_);
  this->key_type_ = object->key_type_;
  Pubkey::operator=(&this->pubkey_,&object->pubkey_);
  SchnorrPubkey::operator=(&this->schnorr_pubkey_,&object->schnorr_pubkey_);
  ExtPrivkey::operator=(&this->extprivkey_,&object->extprivkey_);
  ExtPubkey::operator=(&this->extpubkey_,&object->extpubkey_);
  KeyData::operator=(&this->key_data_,&object->key_data_);
  ::std::__cxx11::string::operator=((string *)&this->argument_,(string *)&object->argument_);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const DescriptorKeyReference& object) {
  key_type_ = object.key_type_;
  pubkey_ = object.pubkey_;
  schnorr_pubkey_ = object.schnorr_pubkey_;
  extprivkey_ = object.extprivkey_;
  extpubkey_ = object.extpubkey_;
  key_data_ = object.key_data_;
  argument_ = object.argument_;
}